

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::flushWriteBuffer(QTextStreamPrivate *this)

{
  bool bVar1;
  ssize_t sVar2;
  qsizetype qVar3;
  size_t in_RCX;
  void *__buf;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool flushed;
  qint64 bytesWritten;
  QByteArray data;
  DecodedData<const_QString_&> *in_stack_ffffffffffffffc0;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((in_RDI->d).ptr == (char16_t *)0x0) && ((in_RDI->d).d != (Data *)0x0)) &&
      (*(int *)((long)&in_RDI[0xc].d.ptr + 4) == 0)) &&
     (bVar1 = QString::isEmpty((QString *)0x13e5f0), !bVar1)) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    QStringEncoder::operator()((QStringEncoder *)&in_RDI[1].d.ptr,(QString *)&in_RDI[8].d.ptr);
    QStringEncoder::DecodedData::operator_cast_to_QByteArray(in_stack_ffffffffffffffc0);
    QString::clear(in_RDI);
    *(undefined1 *)((long)&in_RDI[0xd].d.size + 2) = 1;
    sVar2 = QIODevice::write((QIODevice *)(in_RDI->d).d,(int)&local_20,__buf,in_RCX);
    if (sVar2 < 1) {
      *(undefined4 *)((long)&in_RDI[0xc].d.ptr + 4) = 3;
    }
    else {
      qVar3 = QByteArray::size(&local_20);
      if (sVar2 != qVar3) {
        *(undefined4 *)((long)&in_RDI[0xc].d.ptr + 4) = 3;
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x13e6ec);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::flushWriteBuffer()
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    if (string || !device)
        return;

    // Stream went bye-bye already. Appending further data may succeed again,
    // but would create a corrupted stream anyway.
    if (status != QTextStream::Ok)
        return;

    if (writeBuffer.isEmpty())
        return;

#if defined (Q_OS_WIN)
    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled) {
        device->setTextModeEnabled(false);
        writeBuffer.replace(u'\n', "\r\n"_L1);
    }
#endif

    QByteArray data = fromUtf16(writeBuffer);
    writeBuffer.clear();
    hasWrittenData = true;

    // write raw data to the device
    qint64 bytesWritten = device->write(data);
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::flushWriteBuffer(), device->write(\"%s\") == %d",
           QtDebugUtils::toPrintable(data.constData(), data.size(), 32).constData(),
           int(bytesWritten));
#endif

#if defined (Q_OS_WIN)
    // reset the text flag
    if (textModeEnabled)
        device->setTextModeEnabled(true);
#endif

    if (bytesWritten <= 0) {
        status = QTextStream::WriteFailed;
        return;
    }

    // flush the file
#ifndef QT_NO_QOBJECT
    QFileDevice *file = qobject_cast<QFileDevice *>(device);
    bool flushed = !file || file->flush();
#else
    bool flushed = true;
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::flushWriteBuffer() wrote %d bytes", int(bytesWritten));
#endif
    if (!flushed || bytesWritten != qint64(data.size()))
        status = QTextStream::WriteFailed;
}